

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

bool CanonicalizePath(string *path,uint64_t *slash_bits,string *err)

{
  Metrics *this;
  bool bVar1;
  int iVar2;
  Metric *pMVar3;
  pointer path_00;
  size_t len;
  ScopedMetric metrics_h_scoped;
  size_type local_50;
  string local_48;
  
  if (CanonicalizePath(std::__cxx11::string*,unsigned_long*,std::__cxx11::string*)::metrics_h_metric
      == '\0') {
    iVar2 = __cxa_guard_acquire(&CanonicalizePath(std::__cxx11::string*,unsigned_long*,std::__cxx11::string*)
                                 ::metrics_h_metric);
    this = g_metrics;
    if (iVar2 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar3 = (Metric *)0x0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"canonicalize str",(allocator<char> *)&local_50);
        pMVar3 = Metrics::NewMetric(this,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
      }
      CanonicalizePath::metrics_h_metric = pMVar3;
      __cxa_guard_release(&CanonicalizePath(std::__cxx11::string*,unsigned_long*,std::__cxx11::string*)
                           ::metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)&local_48,CanonicalizePath::metrics_h_metric);
  local_50 = path->_M_string_length;
  if (local_50 == 0) {
    path_00 = (char *)0x0;
  }
  else {
    path_00 = (path->_M_dataplus)._M_p;
  }
  bVar1 = CanonicalizePath(path_00,&local_50,slash_bits,err);
  if (bVar1) {
    std::__cxx11::string::resize((ulong)path);
  }
  ScopedMetric::~ScopedMetric((ScopedMetric *)&local_48);
  return bVar1;
}

Assistant:

bool CanonicalizePath(string* path, uint64_t* slash_bits, string* err) {
  METRIC_RECORD("canonicalize str");
  size_t len = path->size();
  char* str = 0;
  if (len > 0)
    str = &(*path)[0];
  if (!CanonicalizePath(str, &len, slash_bits, err))
    return false;
  path->resize(len);
  return true;
}